

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O1

void __thiscall
OpenMD::CubicSpline::getValueAndDerivativeAt(CubicSpline *this,RealType *t,RealType *v,RealType *dv)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  
  if (this->generated == false) {
    generate(this);
  }
  if (this->isUniform == true) {
    this->j = (int)((*t - *(this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start) * this->dx);
  }
  else {
    iVar1 = this->n;
    this->j = iVar1 + -1;
    if (0 < (long)iVar1) {
      lVar7 = 0;
      do {
        if (*t < (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7]) {
          this->j = (int)lVar7 + -1;
          break;
        }
        lVar7 = lVar7 + 1;
      } while (iVar1 != lVar7);
    }
  }
  iVar1 = this->j;
  iVar5 = this->n + -1;
  if (iVar1 < this->n) {
    iVar5 = iVar1;
  }
  iVar6 = 0;
  if (-1 < iVar1) {
    iVar6 = iVar5;
  }
  this->j = iVar6;
  dVar8 = *t - (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar6];
  this->dt = dVar8;
  pdVar2 = (this->c).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->d).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *v = ((pdVar3[iVar6] * dVar8 + pdVar2[iVar6]) * dVar8 + pdVar4[iVar6]) * dVar8 +
       (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[iVar6];
  dVar8 = pdVar2[iVar6];
  *dv = (dVar8 + dVar8 + this->dt * 3.0 * pdVar3[iVar6]) * this->dt + pdVar4[iVar6];
  return;
}

Assistant:

void CubicSpline::getValueAndDerivativeAt(const RealType& t, RealType& v,
                                            RealType& dv) {
    // Evaluate the spline and first derivative at t using coefficients
    //
    // Input parameters
    //   t = point where spline is to be evaluated.

    if (!generated) generate();

    //  Find the interval ( x[j], x[j+1] ) that contains or is nearest
    //  to t.

    if (isUniform) {
      j = int((t - x_[0]) * dx);

    } else {
      j = n - 1;

      for (int i = 0; i < n; i++) {
        if (t < x_[i]) {
          j = i - 1;
          break;
        }
      }
    }

    j = std::clamp(j, 0, n - 1);

    //  Evaluate the cubic polynomial.

    dt = t - x_[j];

    v  = y_[j] + dt * (b[j] + dt * (c[j] + dt * d[j]));
    dv = b[j] + dt * (2.0 * c[j] + 3.0 * dt * d[j]);
  }